

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

void writeBasisFile(FILE **file,HighsBasis *basis)

{
  pointer pHVar1;
  HighsBasisStatus *status;
  pointer pHVar2;
  HighsBasisStatus *status_1;
  
  fprintf((FILE *)*file,"HiGHS v%d\n",1);
  if (basis->valid != false) {
    fwrite("Valid\n",6,1,(FILE *)*file);
    fprintf((FILE *)*file,"# Columns %d\n",
            (ulong)(uint)(*(int *)&(basis->col_status).
                                   super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                         *(int *)&(basis->col_status).
                                  super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                  ._M_impl.super__Vector_impl_data._M_start));
    pHVar1 = (basis->col_status).
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pHVar2 = (basis->col_status).
                  super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                  super__Vector_impl_data._M_start; pHVar2 != pHVar1; pHVar2 = pHVar2 + 1) {
      fprintf((FILE *)*file,"%d ",(ulong)*pHVar2);
    }
    fputc(10,(FILE *)*file);
    fprintf((FILE *)*file,"# Rows %d\n",
            (ulong)(uint)(*(int *)&(basis->row_status).
                                   super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                         *(int *)&(basis->row_status).
                                  super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                                  ._M_impl.super__Vector_impl_data._M_start));
    pHVar1 = (basis->row_status).
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pHVar2 = (basis->row_status).
                  super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                  super__Vector_impl_data._M_start; pHVar2 != pHVar1; pHVar2 = pHVar2 + 1) {
      fprintf((FILE *)*file,"%d ",(ulong)*pHVar2);
    }
    fputc(10,(FILE *)*file);
    return;
  }
  fwrite("None\n",5,1,(FILE *)*file);
  return;
}

Assistant:

void writeBasisFile(FILE*& file, const HighsBasis& basis) {
  fprintf(file, "HiGHS v%d\n", (int)HIGHS_VERSION_MAJOR);
  if (basis.valid == false) {
    fprintf(file, "None\n");
    return;
  }
  fprintf(file, "Valid\n");
  fprintf(file, "# Columns %d\n", (int)basis.col_status.size());
  for (const auto& status : basis.col_status) fprintf(file, "%d ", (int)status);
  fprintf(file, "\n");
  fprintf(file, "# Rows %d\n", (int)basis.row_status.size());
  for (const auto& status : basis.row_status) fprintf(file, "%d ", (int)status);
  fprintf(file, "\n");
}